

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall cmCTestRunTest::cmCTestRunTest(cmCTestRunTest *this,cmCTestTestHandler *handler)

{
  (this->PrefixCommand)._M_dataplus._M_p = (pointer)&(this->PrefixCommand).field_2;
  (this->PrefixCommand)._M_string_length = 0;
  (this->PrefixCommand).field_2._M_local_buf[0] = '\0';
  (this->ProcessOutput)._M_dataplus._M_p = (pointer)&(this->ProcessOutput).field_2;
  (this->ProcessOutput)._M_string_length = 0;
  (this->ProcessOutput).field_2._M_local_buf[0] = '\0';
  (this->CompressedOutput)._M_dataplus._M_p = (pointer)&(this->CompressedOutput).field_2;
  (this->CompressedOutput)._M_string_length = 0;
  (this->CompressedOutput).field_2._M_local_buf[0] = '\0';
  (this->TestResult).Name._M_dataplus._M_p = (pointer)&(this->TestResult).Name.field_2;
  (this->TestResult).Name._M_string_length = 0;
  (this->TestResult).Name.field_2._M_local_buf[0] = '\0';
  (this->TestResult).Path._M_dataplus._M_p = (pointer)&(this->TestResult).Path.field_2;
  (this->TestResult).Path._M_string_length = 0;
  (this->TestResult).Path.field_2._M_local_buf[0] = '\0';
  (this->TestResult).Reason._M_dataplus._M_p = (pointer)&(this->TestResult).Reason.field_2;
  (this->TestResult).Reason._M_string_length = 0;
  (this->TestResult).Reason.field_2._M_local_buf[0] = '\0';
  (this->TestResult).FullCommandLine._M_dataplus._M_p =
       (pointer)&(this->TestResult).FullCommandLine.field_2;
  (this->TestResult).FullCommandLine._M_string_length = 0;
  (this->TestResult).FullCommandLine.field_2._M_local_buf[0] = '\0';
  (this->TestResult).CompletionStatus._M_dataplus._M_p =
       (pointer)&(this->TestResult).CompletionStatus.field_2;
  (this->TestResult).CompletionStatus._M_string_length = 0;
  (this->TestResult).CompletionStatus.field_2._M_local_buf[0] = '\0';
  (this->TestResult).Output._M_dataplus._M_p = (pointer)&(this->TestResult).Output.field_2;
  (this->TestResult).Output._M_string_length = 0;
  (this->TestResult).Output.field_2._M_local_buf[0] = '\0';
  (this->TestResult).DartString._M_dataplus._M_p = (pointer)&(this->TestResult).DartString.field_2;
  (this->TestResult).DartString._M_string_length = 0;
  (this->TestResult).DartString.field_2._M_local_buf[0] = '\0';
  (this->StartTime)._M_dataplus._M_p = (pointer)&(this->StartTime).field_2;
  (this->StartTime)._M_string_length = 0;
  (this->StartTime).field_2._M_local_buf[0] = '\0';
  (this->ActualCommand)._M_dataplus._M_p = (pointer)&(this->ActualCommand).field_2;
  (this->ActualCommand)._M_string_length = 0;
  (this->ActualCommand).field_2._M_local_buf[0] = '\0';
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->CTest = (handler->super_cmCTestGenericHandler).CTest;
  this->TestHandler = handler;
  this->TestProcess = (cmProcess *)0x0;
  (this->TestResult).TestCount = 0;
  (this->TestResult).Properties = (cmCTestTestProperties *)0x0;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).ReturnValue = 0;
  (this->TestResult).Status = 0;
  std::__cxx11::string::_M_replace((ulong)&this->ProcessOutput,0,(char *)0x0,0x5f43ef);
  std::__cxx11::string::_M_replace
            ((ulong)&this->CompressedOutput,0,(char *)(this->CompressedOutput)._M_string_length,
             0x5f43ef);
  this->CompressionRatio = 2.0;
  this->StopTimePassed = false;
  this->RunUntilFail = false;
  this->NumberOfRunsLeft = 1;
  this->RunAgain = false;
  return;
}

Assistant:

cmCTestRunTest::cmCTestRunTest(cmCTestTestHandler* handler)
{
  this->CTest = handler->CTest;
  this->TestHandler = handler;
  this->TestProcess = 0;
  this->TestResult.ExecutionTime =0;
  this->TestResult.ReturnValue = 0;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = 0;
  this->TestResult.Properties = 0;
  this->ProcessOutput = "";
  this->CompressedOutput = "";
  this->CompressionRatio = 2;
  this->StopTimePassed = false;
  this->NumberOfRunsLeft = 1; // default to 1 run of the test
  this->RunUntilFail = false; // default to run the test once
  this->RunAgain = false;   // default to not having to run again
}